

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap2.cpp
# Opt level: O0

bool clusterG(TSimilarityMap *sim,TKeyPressCollection *keyPresses)

{
  int iVar1;
  int iVar2;
  int iVar3;
  __normal_iterator<Pair_*,_std::vector<Pair,_std::allocator<Pair>_>_> __last;
  __normal_iterator<Pair_*,_std::vector<Pair,_std::allocator<Pair>_>_> __first;
  size_type sVar4;
  reference pvVar5;
  const_reference pvVar6;
  reference pvVar7;
  int *piVar8;
  const_reference pvVar9;
  TClusterId *pTVar10;
  vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *in_RSI;
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  *in_RDI;
  TClusterId *ck_2;
  int k_2;
  TClusterId *ck_1;
  int k_1;
  TValueCC *cc_3;
  TValueCC *cc_2;
  TValueCC *cc_1;
  TClusterId cq;
  int q;
  TClusterId ck;
  int k;
  double sumccj;
  double sumcci;
  double sumcc;
  int nsumj;
  int nsumi;
  int nsum;
  int cnew;
  TClusterId cj;
  TClusterId ci_1;
  value_type *curpair;
  int ip;
  int npairs;
  int i_2;
  TValueCC *cc;
  int j;
  int i_1;
  vector<Pair,_std::allocator<Pair>_> ccpairs;
  TClusterId *ci;
  int i;
  int nclusters;
  int n;
  vector<Pair,_std::allocator<Pair>_> *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  uint uVar11;
  uint in_stack_fffffffffffffee0;
  uint in_stack_fffffffffffffee4;
  int local_104;
  int local_f4;
  int local_d4;
  int local_cc;
  double local_c8;
  double local_c0;
  double local_b8;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  int local_a0;
  int local_9c;
  reference local_98;
  int local_8c;
  int local_88;
  uint local_84;
  Pair *local_80;
  Pair *local_78;
  int local_60;
  int local_5c;
  TValueCC local_58;
  const_reference local_50;
  int local_48;
  int local_44;
  vector<Pair,_std::allocator<Pair>_> local_40;
  TClusterId *local_28;
  int local_1c;
  uint local_18;
  int local_14;
  vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *local_10;
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  sVar4 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::size(in_RSI);
  local_14 = (int)sVar4;
  local_18 = 0;
  for (local_1c = 0; local_1c < local_14; local_1c = local_1c + 1) {
    pvVar5 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::operator[]
                       (local_10,(long)local_1c);
    local_28 = &pvVar5->cid;
    *local_28 = local_1c + 1;
    local_18 = local_18 + 1;
  }
  std::vector<Pair,_std::allocator<Pair>_>::vector((vector<Pair,_std::allocator<Pair>_> *)0x12c037);
  for (local_44 = 0; iVar1 = local_44, local_44 < local_14 + -1; local_44 = local_44 + 1) {
    while (local_48 = iVar1 + 1, local_48 < local_14) {
      pvVar6 = std::
               vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
               ::operator[](local_8,(long)local_44);
      local_50 = std::vector<stMatch,_std::allocator<stMatch>_>::operator[](pvVar6,(long)local_48);
      local_60 = local_44;
      local_5c = local_48;
      local_58 = local_50->cc;
      std::
      vector<clusterG(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,stKeyPressCollection<short>&)::Pair,std::allocator<clusterG(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,stKeyPressCollection<short>&)::Pair>>
      ::
      emplace_back<clusterG(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,stKeyPressCollection<short>&)::Pair>
                ((vector<Pair,_std::allocator<Pair>_> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 (Pair *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      iVar1 = local_48;
    }
  }
  local_78 = (Pair *)std::vector<Pair,_std::allocator<Pair>_>::begin(in_stack_fffffffffffffec8);
  local_80 = (Pair *)std::vector<Pair,_std::allocator<Pair>_>::end(in_stack_fffffffffffffec8);
  __first._M_current._4_4_ = in_stack_fffffffffffffee4;
  __first._M_current._0_4_ = in_stack_fffffffffffffee0;
  __last._M_current._4_4_ = in_stack_fffffffffffffedc;
  __last._M_current._0_4_ = in_stack_fffffffffffffed8;
  std::
  sort<__gnu_cxx::__normal_iterator<clusterG(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,stKeyPressCollection<short>&)::Pair*,std::vector<clusterG(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,stKeyPressCollection<short>&)::Pair,std::allocator<clusterG(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,stKeyPressCollection<short>&)::Pair>>>>
            (__first,__last);
  printf("[+] Top 10 pairs\n");
  for (local_84 = 0; (int)local_84 < 10; local_84 = local_84 + 1) {
    uVar11 = local_84;
    pvVar7 = std::vector<Pair,_std::allocator<Pair>_>::operator[](&local_40,(long)(int)local_84);
    in_stack_fffffffffffffee0 = pvVar7->i;
    pvVar7 = std::vector<Pair,_std::allocator<Pair>_>::operator[](&local_40,(long)(int)local_84);
    in_stack_fffffffffffffee4 = pvVar7->j;
    pvVar7 = std::vector<Pair,_std::allocator<Pair>_>::operator[](&local_40,(long)(int)local_84);
    printf("    Pair %d: %d %d %g\n",pvVar7->cc,(ulong)uVar11,(ulong)in_stack_fffffffffffffee0,
           (ulong)in_stack_fffffffffffffee4);
  }
  sVar4 = std::vector<Pair,_std::allocator<Pair>_>::size(&local_40);
  local_88 = (int)sVar4;
  local_8c = 0;
  while ((local_8c < local_88 &&
         (local_98 = std::vector<Pair,_std::allocator<Pair>_>::operator[](&local_40,(long)local_8c),
         0.5 < local_98->cc || local_98->cc == 0.5))) {
    pvVar5 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::operator[]
                       (local_10,(long)local_98->i);
    local_9c = pvVar5->cid;
    pvVar5 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::operator[]
                       (local_10,(long)local_98->j);
    local_a0 = pvVar5->cid;
    if (local_9c != local_a0) {
      piVar8 = std::min<int>(&local_9c,&local_a0);
      iVar1 = *piVar8;
      local_a8 = 0;
      local_ac = 0;
      local_b0 = 0;
      local_b8 = 0.0;
      local_c0 = 0.0;
      local_c8 = 0.0;
      for (local_cc = 0; local_cc < local_14; local_cc = local_cc + 1) {
        pvVar5 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::
                 operator[](local_10,(long)local_cc);
        iVar2 = pvVar5->cid;
        for (local_d4 = 0; local_d4 < local_14; local_d4 = local_d4 + 1) {
          if (local_d4 != local_cc) {
            pvVar5 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::
                     operator[](local_10,(long)local_d4);
            iVar3 = pvVar5->cid;
            if (((iVar2 == local_9c) || (iVar2 == local_a0)) &&
               ((iVar3 == local_9c || (iVar3 == local_a0)))) {
              pvVar6 = std::
                       vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                       ::operator[](local_8,(long)local_cc);
              pvVar9 = std::vector<stMatch,_std::allocator<stMatch>_>::operator[]
                                 (pvVar6,(long)local_d4);
              local_b8 = pvVar9->cc + local_b8;
              local_a8 = local_a8 + 1;
            }
            if ((iVar2 == local_9c) && (iVar3 == local_9c)) {
              pvVar6 = std::
                       vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                       ::operator[](local_8,(long)local_cc);
              pvVar9 = std::vector<stMatch,_std::allocator<stMatch>_>::operator[]
                                 (pvVar6,(long)local_d4);
              local_c0 = pvVar9->cc + local_c0;
              local_ac = local_ac + 1;
            }
            if ((iVar2 == local_a0) && (iVar3 == local_a0)) {
              pvVar6 = std::
                       vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                       ::operator[](local_8,(long)local_cc);
              pvVar9 = std::vector<stMatch,_std::allocator<stMatch>_>::operator[]
                                 (pvVar6,(long)local_d4);
              local_c8 = pvVar9->cc + local_c8;
              local_b0 = local_b0 + 1;
            }
          }
        }
      }
      if (0 < (int)local_ac) {
        local_c0 = local_c0 / (double)(int)local_ac;
      }
      if (0 < (int)local_b0) {
        local_c8 = local_c8 / (double)(int)local_b0;
      }
      printf("Merge avg n = %4d, cc = %8.5f, ni = %4d, cci = %8.5f, nj = %4d, ccj = %8.5f\n",
             local_b8 / (double)(int)local_a8,local_c0,local_c8,(ulong)local_a8,(ulong)local_ac,
             (ulong)local_b0);
      if ((local_c0 + local_c8) * 0.4 < local_b8 / (double)(int)local_a8) {
        for (local_f4 = 0; local_f4 < local_14; local_f4 = local_f4 + 1) {
          pvVar5 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::
                   operator[](local_10,(long)local_f4);
          pTVar10 = &pvVar5->cid;
          if ((*pTVar10 == local_9c) || (*pTVar10 == local_a0)) {
            *pTVar10 = iVar1;
          }
        }
        local_18 = local_18 - 1;
        printf("Clusters %3d %5.4f:",local_98->cc,(ulong)local_18);
        for (local_104 = 0; local_104 < local_14; local_104 = local_104 + 1) {
          pvVar5 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::
                   operator[](local_10,(long)local_104);
          printf(" %3d",(ulong)(uint)pvVar5->cid);
        }
        printf("\n");
      }
    }
    local_8c = local_8c + 1;
  }
  std::vector<Pair,_std::allocator<Pair>_>::~vector
            ((vector<Pair,_std::allocator<Pair>_> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  return true;
}

Assistant:

bool clusterG(const TSimilarityMap & sim, TKeyPressCollection & keyPresses) {
    struct Pair {
        int i = -1;
        int j = -1;
        TValueCC cc = -1.0;

        bool operator < (const Pair & a) const { return cc > a.cc; }
    };

    int n = keyPresses.size();

    int nclusters = 0;
    for (int i = 0; i < n; ++i) {
        auto & ci = keyPresses[i].cid;

        ci = i + 1;
        ++nclusters;
    }

    std::vector<Pair> ccpairs;
    for (int i = 0; i < n - 1; ++i) {
        for (int j = i + 1; j < n; ++j) {
            auto & cc = sim[i][j].cc;

            ccpairs.emplace_back(Pair{i, j, cc});
        }
    }

    std::sort(ccpairs.begin(), ccpairs.end());

    printf("[+] Top 10 pairs\n");
    for (int i = 0; i < 10; ++i) {
        printf("    Pair %d: %d %d %g\n", i, ccpairs[i].i, ccpairs[i].j, ccpairs[i].cc);
    }

    int npairs = ccpairs.size();
    for (int ip = 0; ip < npairs; ++ip) {
        auto & curpair = ccpairs[ip];
        //if (frand() > curpair.cc) continue;
        if (curpair.cc < 0.50) break;

        auto ci = keyPresses[curpair.i].cid;
        auto cj = keyPresses[curpair.j].cid;

        if (ci == cj) continue;
        auto cnew = std::min(ci, cj);
        int nsum = 0;
        int nsumi = 0;
        int nsumj = 0;
        double sumcc = 0.0;
        double sumcci = 0.0;
        double sumccj = 0.0;
        for (int k = 0; k < n; ++k) {
            auto ck = keyPresses[k].cid;

            for (int q = 0; q < n; ++q) {
                if (q == k) continue;
                auto cq = keyPresses[q].cid;

                if ((ck == ci || ck == cj) && (cq == ci || cq == cj)) {
                    auto & cc     = sim[k][q].cc;
                    //auto & offset = sim[k][q].offset;

                    sumcc += cc;
                    ++nsum;
                }
                if (ck == ci && cq == ci) {
                    auto & cc     = sim[k][q].cc;
                    //auto & offset = sim[k][q].offset;

                    sumcci += cc;
                    ++nsumi;
                }
                if (ck == cj && cq == cj) {
                    auto & cc     = sim[k][q].cc;
                    //auto & offset = sim[k][q].offset;

                    sumccj += cc;
                    ++nsumj;
                }
            }
        }
        sumcc /= nsum;
        if (nsumi > 0) sumcci /= nsumi;
        if (nsumj > 0) sumccj /= nsumj;
        printf("Merge avg n = %4d, cc = %8.5f, ni = %4d, cci = %8.5f, nj = %4d, ccj = %8.5f\n", nsum, sumcc, nsumi, sumcci, nsumj, sumccj);

        //if (sumcc < 1.000*curpair.cc) continue;
        //if (sumcc > 0.75*sumccj && sumcc > 0.75*sumcci) {
        if (sumcc > 0.4*(sumcci + sumccj)) {
        } else {
            continue;
        }

        for (int k = 0; k < n; ++k) {
            auto & ck = keyPresses[k].cid;

            if (ck == ci || ck == cj) ck = cnew;
        }
        --nclusters;

        printf("Clusters %3d %5.4f:", nclusters, curpair.cc);
        for (int k = 0; k < n; ++k) {
            auto & ck = keyPresses[k].cid;

            printf(" %3d", ck);
        }
        printf("\n");
    }

    return true;
}